

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O1

KeySym anon_unknown.dwarf_2e9d46::scancodeToKeySym(Scancode code)

{
  char cVar1;
  Display *display;
  KeySym KVar2;
  
  display = sf::priv::OpenDisplay();
  ensureMapping();
  if (code == Unknown) {
    cVar1 = '\0';
  }
  else {
    cVar1 = (&(anonymous_namespace)::scancodeToKeycode)[code];
  }
  if (cVar1 == '\0') {
    KVar2 = 0;
  }
  else {
    KVar2 = XkbKeycodeToKeysym(display,cVar1,0,0);
  }
  sf::priv::CloseDisplay(display);
  return KVar2;
}

Assistant:

KeySym scancodeToKeySym(sf::Keyboard::Scancode code)
{
    Display* display = sf::priv::OpenDisplay();

    KeySym keysym = NoSymbol;
    KeyCode keycode = scancodeToKeyCode(code);

    if (keycode != NullKeyCode) // ensure that this Scancode is mapped to keycode
        keysym = XkbKeycodeToKeysym(display, keycode, 0, 0);

    sf::priv::CloseDisplay(display);

    return keysym;
}